

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O2

Vector3D * __thiscall
CGL::CosineWeightedHemisphereSampler3D::get_sample
          (Vector3D *__return_storage_ptr__,CosineWeightedHemisphereSampler3D *this,double *pdf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  dVar1 = random_uniform();
  dVar2 = random_uniform();
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar1;
  if (dVar1 < 0.0) {
    dVar3 = sqrt(dVar1);
  }
  else {
    auVar6 = vsqrtsd_avx(auVar6,auVar6);
    dVar3 = auVar6._0_8_;
  }
  dVar1 = 1.0 - dVar1;
  if (dVar1 < 0.0) {
    dVar4 = sqrt(dVar1);
  }
  else {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar1;
    auVar6 = vsqrtsd_avx(auVar5,auVar5);
    dVar4 = auVar6._0_8_;
  }
  *pdf = dVar4 / 3.141592653589793;
  dVar4 = cos(dVar2 * 6.283185307179586);
  dVar2 = sin(dVar2 * 6.283185307179586);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    auVar6 = vsqrtsd_avx(auVar7,auVar7);
    dVar1 = auVar6._0_8_;
  }
  (__return_storage_ptr__->field_0).field_0.x = dVar4 * dVar3;
  (__return_storage_ptr__->field_0).field_0.y = dVar2 * dVar3;
  (__return_storage_ptr__->field_0).field_0.z = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Vector3D CosineWeightedHemisphereSampler3D::get_sample(double *pdf) const {

  double Xi1 = random_uniform();
  double Xi2 = random_uniform();

  double r = sqrt(Xi1);
  double theta = 2. * PI * Xi2;
  *pdf = sqrt(1-Xi1) / PI;
  return Vector3D(r*cos(theta), r*sin(theta), sqrt(1-Xi1));
}